

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-decimal128.c
# Opt level: O0

void bson_decimal128_to_string(bson_decimal128_t *dec,char *str)

{
  _bson_uint128_t value;
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int local_16c;
  int local_158;
  uint32_t local_154;
  int32_t radix_position;
  uint32_t least_digits;
  int k;
  int j;
  size_t i;
  int iStack_138;
  _bson_uint128_t significand128;
  uint8_t significand_msb;
  _Bool is_zero;
  int32_t scientific_exponent;
  int32_t exponent;
  uint32_t *significand_read;
  uint32_t significand [36];
  uint local_80;
  uint32_t significand_digits;
  uint32_t biased_exponent;
  uint32_t combination;
  uint32_t low;
  uint32_t midl;
  uint32_t midh;
  uint32_t high;
  char significand_str [35];
  char *local_38;
  char *str_out;
  uint32_t EXPONENT_BIAS;
  uint32_t COMBINATION_NAN;
  uint32_t COMBINATION_INFINITY;
  uint32_t EXPONENT_MASK;
  uint32_t COMBINATION_MASK;
  char *str_local;
  bson_decimal128_t *dec_local;
  
  significand[0x23] = 0;
  memset(&significand_read,0,0x90);
  _scientific_exponent = &significand_read;
  significand128.parts[2]._3_1_ = 0;
  memset(&midh,0,0x23);
  local_38 = str;
  if ((long)dec->high < 0) {
    local_38 = str + 1;
    *str = '-';
  }
  significand128.parts[1] = (uint32_t)dec->low;
  significand128.parts[0] = (uint32_t)(dec->low >> 0x20);
  iStack_138 = (int)dec->high;
  uVar2 = (uint)(dec->high >> 0x20);
  uVar3 = uVar2 >> 0x1a & 0x1f;
  if (uVar3 >> 3 == 3) {
    if (uVar3 == 0x1e) {
      strcpy(local_38,"Infinity");
      return;
    }
    if (uVar3 == 0x1f) {
      strcpy(str,"NaN");
      return;
    }
    local_80 = uVar2 >> 0xf;
    significand128.parts[2]._2_1_ = ((byte)(uVar2 >> 0xe) & 1) + 8;
  }
  else {
    significand128.parts[2]._2_1_ = (byte)(uVar2 >> 0xe) & 7;
    local_80 = uVar2 >> 0x11;
  }
  local_80 = local_80 & 0x3fff;
  local_158 = local_80 - 0x1820;
  i._4_4_ = (uVar2 & 0x3fff) + (significand128.parts[2]._2_1_ & 0xf) * 0x4000;
  if ((((i._4_4_ == 0) && (iStack_138 == 0)) && (significand128.parts[0] == 0)) &&
     (significand128.parts[1] == 0)) {
    significand128.parts[2]._3_1_ = 1;
  }
  else if (i._4_4_ < 0x20000) {
    for (radix_position = 3; -1 < radix_position; radix_position = radix_position + -1) {
      local_154 = 0;
      value.parts[1] = iStack_138;
      value.parts[0] = i._4_4_;
      value.parts[2] = significand128.parts[0];
      value.parts[3] = significand128.parts[1];
      _bson_uint128_divide1B(value,(_bson_uint128_t *)((long)&i + 4),&local_154);
      if (local_154 != 0) {
        for (least_digits = 8; -1 < (int)least_digits; least_digits = least_digits - 1) {
          significand[(long)(int)(radix_position * 9 + least_digits) + -2] = local_154 % 10;
          local_154 = local_154 / 10;
        }
      }
    }
  }
  else {
    significand128.parts[2]._3_1_ = 1;
  }
  if ((significand128.parts[2]._3_1_ & 1) == 0) {
    significand[0x23] = 0x24;
    for (; *(int *)_scientific_exponent == 0;
        _scientific_exponent = (uint32_t **)((long)_scientific_exponent + 4)) {
      significand[0x23] = significand[0x23] - 1;
    }
  }
  else {
    significand[0x23] = 1;
    significand_read._0_4_ = 0;
  }
  significand128.parts[3] = (significand[0x23] - 1) + local_158;
  if (((int)significand128.parts[3] < -6) || (0 < local_158)) {
    *local_38 = (char)*(int *)_scientific_exponent + '0';
    significand[0x23] = significand[0x23] - 1;
    pcVar1 = local_38 + 1;
    if (significand[0x23] != 0) {
      local_38[1] = '.';
      pcVar1 = local_38 + 2;
    }
    local_38 = pcVar1;
    for (_k = 0; _scientific_exponent = (uint32_t **)((long)_scientific_exponent + 4),
        _k < significand[0x23] && (long)local_38 - (long)str < 0x24; _k = _k + 1) {
      *local_38 = (char)*(int *)_scientific_exponent + '0';
      local_38 = local_38 + 1;
    }
    *local_38 = 'E';
    bson_snprintf(local_38 + 1,6,"%+d",(ulong)significand128.parts[3]);
  }
  else if (local_158 < 0) {
    local_158 = significand[0x23] + local_158;
    if (local_158 < 1) {
      *local_38 = '0';
      local_38 = local_38 + 1;
    }
    else {
      for (_k = 0; _k < (ulong)(long)local_158 && (long)local_38 - (long)str < 0x2b; _k = _k + 1) {
        *local_38 = (char)*(int *)_scientific_exponent + '0';
        _scientific_exponent = (uint32_t **)((long)_scientific_exponent + 4);
        local_38 = local_38 + 1;
      }
    }
    *local_38 = '.';
    while( true ) {
      local_38 = local_38 + 1;
      if (-1 < local_158) break;
      *local_38 = '0';
      local_158 = local_158 + 1;
    }
    _k = 0;
    while( true ) {
      if (local_158 < 1) {
        local_16c = 0;
      }
      else {
        local_16c = local_158;
      }
      if (significand[0x23] - local_16c <= _k || 0x2a < (long)local_38 - (long)str) break;
      *local_38 = (char)*(int *)_scientific_exponent + '0';
      _k = _k + 1;
      _scientific_exponent = (uint32_t **)((long)_scientific_exponent + 4);
      local_38 = local_38 + 1;
    }
    *local_38 = '\0';
  }
  else {
    for (_k = 0; _k < significand[0x23] && (long)local_38 - (long)str < 0x24; _k = _k + 1) {
      *local_38 = (char)*(int *)_scientific_exponent + '0';
      _scientific_exponent = (uint32_t **)((long)_scientific_exponent + 4);
      local_38 = local_38 + 1;
    }
    *local_38 = '\0';
  }
  return;
}

Assistant:

void
bson_decimal128_to_string (const bson_decimal128_t *dec, /* IN  */
                           char *str)                    /* OUT */
{
   uint32_t COMBINATION_MASK = 0x1f;   /* Extract least significant 5 bits */
   uint32_t EXPONENT_MASK = 0x3fff;    /* Extract least significant 14 bits */
   uint32_t COMBINATION_INFINITY = 30; /* Value of combination field for Inf */
   uint32_t COMBINATION_NAN = 31;      /* Value of combination field for NaN */
   uint32_t EXPONENT_BIAS = 6176;      /* decimal128 exponent bias */

   char *str_out = str;      /* output pointer in string */
   char significand_str[35]; /* decoded significand digits */


   /* Note: bits in this routine are referred to starting at 0, */
   /* from the sign bit, towards the coefficient. */
   uint32_t high;                   /* bits 0 - 31 */
   uint32_t midh;                   /* bits 32 - 63 */
   uint32_t midl;                   /* bits 64 - 95 */
   uint32_t low;                    /* bits 96 - 127 */
   uint32_t combination;            /* bits 1 - 5 */
   uint32_t biased_exponent;        /* decoded biased exponent (14 bits) */
   uint32_t significand_digits = 0; /* the number of significand digits */
   uint32_t significand[36] = {0};  /* the base-10 digits in the significand */
   uint32_t *significand_read = significand; /* read pointer into significand */
   int32_t exponent;                         /* unbiased exponent */
   int32_t scientific_exponent; /* the exponent if scientific notation is
                                 * used */
   bool is_zero = false;        /* true if the number is zero */

   uint8_t significand_msb; /* the most signifcant significand bits (50-46) */
   _bson_uint128_t
      significand128; /* temporary storage for significand decoding */
   size_t i;          /* indexing variables */
   int j, k;

   memset (significand_str, 0, sizeof (significand_str));

   if ((int64_t) dec->high < 0) { /* negative */
      *(str_out++) = '-';
   }

   low = (uint32_t) dec->low, midl = (uint32_t) (dec->low >> 32),
   midh = (uint32_t) dec->high, high = (uint32_t) (dec->high >> 32);

   /* Decode combination field and exponent */
   combination = (high >> 26) & COMBINATION_MASK;

   if (BSON_UNLIKELY ((combination >> 3) == 3)) {
      /* Check for 'special' values */
      if (combination == COMBINATION_INFINITY) { /* Infinity */
         strcpy (str_out, BSON_DECIMAL128_INF);
         return;
      } else if (combination == COMBINATION_NAN) { /* NaN */
         /* str, not str_out, to erase the sign */
         strcpy (str, BSON_DECIMAL128_NAN);
         /* we don't care about the NaN payload. */
         return;
      } else {
         biased_exponent = (high >> 15) & EXPONENT_MASK;
         significand_msb = 0x8 + ((high >> 14) & 0x1);
      }
   } else {
      significand_msb = (high >> 14) & 0x7;
      biased_exponent = (high >> 17) & EXPONENT_MASK;
   }

   exponent = biased_exponent - EXPONENT_BIAS;
   /* Create string of significand digits */

   /* Convert the 114-bit binary number represented by */
   /* (high, midh, midl, low) to at most 34 decimal */
   /* digits through modulo and division. */
   significand128.parts[0] = (high & 0x3fff) + ((significand_msb & 0xf) << 14);
   significand128.parts[1] = midh;
   significand128.parts[2] = midl;
   significand128.parts[3] = low;

   if (significand128.parts[0] == 0 && significand128.parts[1] == 0 &&
       significand128.parts[2] == 0 && significand128.parts[3] == 0) {
      is_zero = true;
   } else if (significand128.parts[0] >= (1 << 17)) {
      /* The significand is non-canonical or zero.
       * In order to preserve compatability with the densely packed decimal
       * format, the maximum value for the significand of decimal128 is
       * 1e34 - 1.  If the value is greater than 1e34 - 1, the IEEE 754
       * standard dictates that the significand is interpreted as zero.
       */
      is_zero = true;
   } else {
      for (k = 3; k >= 0; k--) {
         uint32_t least_digits = 0;
         _bson_uint128_divide1B (
            significand128, &significand128, &least_digits);

         /* We now have the 9 least significant digits (in base 2). */
         /* Convert and output to string. */
         if (!least_digits) {
            continue;
         }

         for (j = 8; j >= 0; j--) {
            significand[k * 9 + j] = least_digits % 10;
            least_digits /= 10;
         }
      }
   }

   /* Output format options: */
   /* Scientific - [-]d.dddE(+/-)dd or [-]dE(+/-)dd */
   /* Regular    - ddd.ddd */

   if (is_zero) {
      significand_digits = 1;
      *significand_read = 0;
   } else {
      significand_digits = 36;
      while (!(*significand_read)) {
         significand_digits--;
         significand_read++;
      }
   }

   scientific_exponent = significand_digits - 1 + exponent;

   /* The scientific exponent checks are dictated by the string conversion
    * specification and are somewhat arbitrary cutoffs.
    *
    * We must check exponent > 0, because if this is the case, the number
    * has trailing zeros.  However, we *cannot* output these trailing zeros,
    * because doing so would change the precision of the value, and would
    * change stored data if the string converted number is round tripped.
    */
   if (scientific_exponent < -6 || exponent > 0) {
      /* Scientific format */
      *(str_out++) = *(significand_read++) + '0';
      significand_digits--;

      if (significand_digits) {
         *(str_out++) = '.';
      }

      for (i = 0; i < significand_digits && (str_out - str) < 36; i++) {
         *(str_out++) = *(significand_read++) + '0';
      }
      /* Exponent */
      *(str_out++) = 'E';
      bson_snprintf (str_out, 6, "%+d", scientific_exponent);
   } else {
      /* Regular format with no decimal place */
      if (exponent >= 0) {
         for (i = 0; i < significand_digits && (str_out - str) < 36; i++) {
            *(str_out++) = *(significand_read++) + '0';
         }
         *str_out = '\0';
      } else {
         int32_t radix_position = significand_digits + exponent;

         if (radix_position > 0) { /* non-zero digits before radix */
            for (i = 0;
                 i < radix_position && (str_out - str) < BSON_DECIMAL128_STRING;
                 i++) {
               *(str_out++) = *(significand_read++) + '0';
            }
         } else { /* leading zero before radix point */
            *(str_out++) = '0';
         }

         *(str_out++) = '.';
         while (radix_position++ < 0) { /* add leading zeros after radix */
            *(str_out++) = '0';
         }

         for (i = 0;
              (i < significand_digits - BSON_MAX (radix_position - 1, 0)) &&
              (str_out - str) < BSON_DECIMAL128_STRING;
              i++) {
            *(str_out++) = *(significand_read++) + '0';
         }
         *str_out = '\0';
      }
   }
}